

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_markdown_generator.cc
# Opt level: O2

int __thiscall t_markdown_generator::print_type(t_markdown_generator *this,t_type *ttype)

{
  ofstream_with_content_based_conditional_update *poVar1;
  _func_int **pp_Var2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  t_markdown_generator *this_00;
  undefined1 local_d0 [32];
  string prog_name;
  string type_name;
  string local_70;
  string local_50;
  
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xd])(ttype);
  pp_Var2 = (ttype->super_t_doc)._vptr_t_doc;
  if ((char)iVar3 != '\0') {
    iVar3 = (*pp_Var2[0xe])();
    if ((char)iVar3 == '\0') {
      iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
      if ((char)iVar3 == '\0') {
        iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
        if ((char)iVar3 == '\0') {
          return 0;
        }
        std::operator<<((ostream *)&this->f_out_,"map&lt;");
        iVar4 = print_type(this,*(t_type **)&ttype[1].super_t_doc.has_doc_);
        std::operator<<((ostream *)&this->f_out_,", ");
        iVar3 = print_type(this,*(t_type **)&ttype[1].annotations_._M_t._M_impl);
        iVar3 = iVar3 + iVar4 + 5;
      }
      else {
        std::operator<<((ostream *)&this->f_out_,"set&lt;");
        iVar3 = print_type(this,*(t_type **)&ttype[1].super_t_doc.has_doc_);
        iVar3 = iVar3 + 5;
      }
    }
    else {
      std::operator<<((ostream *)&this->f_out_,"list&lt;");
      iVar3 = print_type(this,*(t_type **)&ttype[1].super_t_doc.has_doc_);
      iVar3 = iVar3 + 6;
    }
    std::operator<<((ostream *)&this->f_out_,"&gt;");
    return iVar3;
  }
  iVar3 = (*pp_Var2[5])(ttype);
  if ((char)iVar3 != '\0') {
    poVar5 = std::operator<<((ostream *)&this->f_out_,"```");
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[7])(ttype);
    if ((char)iVar3 == '\0') {
      iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
      std::__cxx11::string::string((string *)&prog_name,(string *)CONCAT44(extraout_var_00,iVar3));
    }
    else {
      std::__cxx11::string::string((string *)&prog_name,"binary",(allocator *)&type_name);
    }
    poVar5 = std::operator<<(poVar5,(string *)&prog_name);
    std::operator<<(poVar5,"```");
    std::__cxx11::string::~string((string *)&prog_name);
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
    return (int)*(undefined8 *)(CONCAT44(extraout_var_01,iVar3) + 8);
  }
  std::__cxx11::string::string((string *)&prog_name,(string *)&ttype->program_->name_);
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
  std::__cxx11::string::string((string *)&type_name,(string *)CONCAT44(extraout_var,iVar3));
  poVar1 = &this->f_out_;
  poVar5 = std::operator<<((ostream *)poVar1,"[```");
  poVar5 = std::operator<<(poVar5,(string *)&type_name);
  poVar5 = std::operator<<(poVar5,"```](");
  std::__cxx11::string::string((string *)&local_70,(string *)&prog_name);
  make_file_name(&local_50,this,&local_70);
  make_file_link((string *)local_d0,this,&local_50);
  poVar5 = std::operator<<(poVar5,(string *)local_d0);
  this_00 = (t_markdown_generator *)0x2dc171;
  std::operator<<(poVar5,"#");
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[9])(ttype);
  if ((char)iVar3 == '\0') {
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xc])(ttype);
    if ((char)iVar3 == '\0') {
      iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xb])(ttype);
      if ((char)iVar3 == '\0') {
        iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype);
        if ((char)iVar3 == '\0') {
          iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0x11])(ttype);
          if ((char)iVar3 == '\0') goto LAB_001f257a;
          this_00 = (t_markdown_generator *)0x2e5960;
        }
        else {
          this_00 = (t_markdown_generator *)0x2e5980;
        }
      }
      else {
        this_00 = (t_markdown_generator *)0x2e59ac;
        if (ttype[1].annotations_._M_t._M_impl.field_0x1 != '\0') {
          this_00 = (t_markdown_generator *)0x2e59a4;
        }
      }
    }
    else {
      this_00 = (t_markdown_generator *)0x2e5998;
    }
  }
  else {
    this_00 = (t_markdown_generator *)0x2e598e;
  }
  std::operator<<((ostream *)poVar1,(char *)this_00);
LAB_001f257a:
  if (ttype->program_ != (this->super_t_generator).program_) {
    str_to_id((string *)local_d0,this_00,&prog_name);
    this_00 = (t_markdown_generator *)local_d0;
    std::operator<<((ostream *)poVar1,(string *)this_00);
    std::__cxx11::string::~string((string *)local_d0);
    type_name._M_string_length._0_4_ =
         (int)type_name._M_string_length + (int)prog_name._M_string_length + 1;
  }
  str_to_id((string *)local_d0,this_00,&type_name);
  poVar5 = std::operator<<((ostream *)poVar1,(string *)local_d0);
  std::operator<<(poVar5,')');
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string((string *)&type_name);
  std::__cxx11::string::~string((string *)&prog_name);
  return (int)type_name._M_string_length;
}

Assistant:

int t_markdown_generator::print_type(t_type* ttype) {
  std::string::size_type len = 0;
  if (ttype->is_container()) {
    if (ttype->is_list()) {
      f_out_ << "list&lt;";
      len = 6 + print_type(((t_list*)ttype)->get_elem_type());
      f_out_ << "&gt;";
    } else if (ttype->is_set()) {
      f_out_ << "set&lt;";
      len = 5 + print_type(((t_set*)ttype)->get_elem_type());
      f_out_ << "&gt;";
    } else if (ttype->is_map()) {
      f_out_ << "map&lt;";
      len = 5 + print_type(((t_map*)ttype)->get_key_type());
      f_out_ << ", ";
      len += print_type(((t_map*)ttype)->get_val_type());
      f_out_ << "&gt;";
    }
  } else if (ttype->is_base_type()) {
    f_out_ << "```" << (ttype->is_binary() ? "binary" : ttype->get_name()) 
           << "```";
    len = ttype->get_name().size();
  } else {
    string prog_name = ttype->get_program()->get_name();
    string type_name = ttype->get_name();
    f_out_ << "[```" << type_name << "```](" 
           << make_file_link(make_file_name(prog_name)) << "#";
    if (ttype->is_typedef()) {
      f_out_ << "typedef-";
    } else if (ttype->is_xception()) {
      f_out_ << "exception-";
    } else if (ttype->is_struct()) {
      if(((t_struct*)ttype)->is_union())
        f_out_ << "union-";
      else
        f_out_ << "struct-";
    } else if (ttype->is_enum()) {
      f_out_ << "enumeration-";
    } else if (ttype->is_service()) {
      f_out_ << "service-";
    }
    len = type_name.size();
    if (ttype->get_program() != program_) {
      f_out_ << str_to_id(prog_name); 
      len += prog_name.size() + 1;
    }
    f_out_ <<  str_to_id(type_name) << ')';
  }
  return (int)len;
}